

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElabVisitors.h
# Opt level: O2

bool __thiscall
slang::ast::DiagnosticVisitor::handleDefault<slang::ast::VariableSymbol>
          (DiagnosticVisitor *this,VariableSymbol *symbol)

{
  bool bVar1;
  DeclaredType *pDVar2;
  long lVar3;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> sVar4;
  not_null<const_slang::ast::DeclaredType_*> declaredType;
  not_null<const_slang::ast::DeclaredType_*> local_20;
  
  if (((ulong)this->errorLimit < *this->numErrors) || (this->hierarchyProblem != false)) {
    bVar1 = false;
  }
  else {
    local_20 = ValueSymbol::getDeclaredType(&symbol->super_ValueSymbol);
    pDVar2 = not_null<const_slang::ast::DeclaredType_*>::get(&local_20);
    if (pDVar2 != (DeclaredType *)0x0) {
      pDVar2 = not_null<const_slang::ast::DeclaredType_*>::get(&local_20);
      DeclaredType::getType(pDVar2);
      pDVar2 = not_null<const_slang::ast::DeclaredType_*>::get(&local_20);
      DeclaredType::getInitializer(pDVar2);
    }
    sVar4 = Compilation::getAttributes(this->compilation,symbol);
    for (lVar3 = 0; sVar4.size_ << 3 != lVar3; lVar3 = lVar3 + 8) {
      AttributeSymbol::getValue(*(AttributeSymbol **)((long)sVar4.data_ + lVar3));
    }
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool handleDefault(const T& symbol) {
        if (numErrors > errorLimit || hierarchyProblem)
            return false;

        if constexpr (std::is_base_of_v<Symbol, T>) {
            auto declaredType = symbol.getDeclaredType();
            if (declaredType) {
                declaredType->getType();
                declaredType->getInitializer();
            }

            if constexpr (std::is_same_v<ParameterSymbol, T> ||
                          std::is_same_v<EnumValueSymbol, T> ||
                          std::is_same_v<SpecparamSymbol, T>) {
                symbol.getValue();
            }

            for (auto attr : compilation.getAttributes(symbol))
                attr->getValue();
        }

        if constexpr (is_detected_v<getBody_t, T>) {
            auto& body = symbol.getBody();
            if (body.bad())
                return true;

            body.visit(*this);
        }

        visitDefault(symbol);
        return true;
    }